

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MySharedMemory.cpp
# Opt level: O2

bool __thiscall MySharedMemory::attach(MySharedMemory *this,size_t size)

{
  int __fd;
  void *pvVar1;
  sem_t *psVar2;
  
  __fd = shm_open((this->key)._M_dataplus._M_p,2,0x1b6);
  if (__fd != -1) {
    pvVar1 = mmap((void *)0x0,size,3,1,__fd,0);
    this->addr = pvVar1;
    if (pvVar1 != (void *)0xffffffffffffffff) {
      this->mapping_size = size;
      std::operator<<((ostream *)&std::cout,"Hello\n");
      psVar2 = sem_open((this->key)._M_dataplus._M_p,2);
      this->sem = (sem_t *)psVar2;
      if (psVar2 != (sem_t *)0x0) {
        close(__fd);
        return true;
      }
    }
  }
  std::__cxx11::string::assign((char *)&this->error_message);
  return false;
}

Assistant:

bool MySharedMemory::attach(size_t size) {
    #ifdef _WIN32
    this->mapping_size = size;
    memoryHandle = OpenFileMapping(
            FILE_MAP_ALL_ACCESS,   // read/write access
            FALSE,                 // do not inherit the name
            key.c_str());
    if (memoryHandle == NULL)
    {
        error_message =  "Could not attach to file mapping object";
        return false;
    }
    addr = MapViewOfFile(memoryHandle, // handle to map object
                        FILE_MAP_ALL_ACCESS,  // read/write permission
                        0,
                        0,
                        this->mapping_size);
    if (addr == NULL)
    {
        error_message =  "Could not map view";
        return false;
    }

    semaphoreHandle = OpenSemaphore(
            SEMAPHORE_MODIFY_STATE | SYNCHRONIZE,
            FALSE,
            (key + "SEM").c_str());

    return true;
    #elif __linux__ || __APPLE__
    int fd = shm_open(key.c_str(), O_RDWR, 0666);
    if (fd == -1) {
        error_message = "Error while opening shared memory object\n";
        return false;
    }

    addr = mmap(nullptr, size, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    if (addr == MAP_FAILED) {
        error_message = "Error wile mapping a file\n";
        return false;
    }
    mapping_size = size;

    std::cout << "Hello\n";

    sem = sem_open(key.c_str(), O_RDWR);
    if (sem == SEM_FAILED) {
        error_message = "Error while opening a semaphor\n";
        return false;
    }

    close(fd);
    return true;
    #endif
}